

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

TTDVar TTD::NSSnapValues::ParseTTDVar(bool readSeparator,FileReader *reader)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint64 uVar5;
  uint64 uVar6;
  undefined4 *puVar7;
  TTDVar pvVar8;
  undefined7 in_register_00000039;
  double value;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000039,readSeparator) & 0xffffffff);
  (*reader->_vptr_FileReader[3])(reader,0x14,0);
  iVar3 = (*reader->_vptr_FileReader[0x12])(reader,0);
  switch(iVar3) {
  case 1:
    FileReader::ReadNull(reader,nullVal,true);
    pvVar8 = (TTDVar)0x0;
    break;
  case 2:
    uVar4 = FileReader::ReadInt32(reader,i32Val,true);
    pvVar8 = (TTDVar)((ulong)uVar4 | 0x1000000000000);
    break;
  case 3:
    value = FileReader::ReadDouble(reader,doubleVal,true);
    uVar5 = Js::NumberUtilities::ToSpecial(value);
    bVar2 = Js::NumberUtilities::IsNan(value);
    if (((bVar2) && (uVar6 = Js::NumberUtilities::ToSpecial(value), uVar6 != 0xfff8000000000000)) &&
       (uVar6 = Js::NumberUtilities::ToSpecial(value), uVar6 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                         ,0xa2,
                         "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                         ,"We should only produce a NaN with this value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    pvVar8 = (TTDVar)(uVar5 ^ 0xfffc000000000000);
    break;
  case 4:
    pvVar8 = (TTDVar)FileReader::ReadAddr(reader,ptrIdVal,true);
    break;
  default:
    TTDAbort_unrecoverable_error("Is there something else?");
  }
  (*reader->_vptr_FileReader[7])(reader);
  return pvVar8;
}

Assistant:

TTDVar ParseTTDVar(bool readSeparator, FileReader* reader)
        {
            reader->ReadRecordStart(readSeparator);

            TTDVar res = nullptr;
            TTDVarEmitTag tag = reader->ReadTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag);
            if(tag == TTDVarEmitTag::TTDVarNull)
            {
                reader->ReadNull(NSTokens::Key::nullVal, true);
                res = nullptr;
            }
            else if(tag == TTDVarEmitTag::TTDVarInt)
            {
                int32 intVal = reader->ReadInt32(NSTokens::Key::i32Val, true);
                res = Js::TaggedInt::ToVarUnchecked(intVal);
            }
#if FLOATVAR
            else if(tag == TTDVarEmitTag::TTDVarDouble)
            {
                double doubleVal = reader->ReadDouble(NSTokens::Key::doubleVal, true);
                res = Js::JavascriptNumber::NewInlined(doubleVal, nullptr);
            }
#endif
            else
            {
                TTDAssert(tag == TTDVarEmitTag::TTDVarAddr, "Is there something else?");

                TTD_PTR_ID addrVal = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
                res = TTD_COERCE_PTR_ID_TO_VAR(addrVal);
            }